

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O2

bool __thiscall
cmExportInstallFileGenerator::GenerateMainFile(cmExportInstallFileGenerator *this,ostream *os)

{
  cmGeneratorTarget *this_00;
  bool bVar1;
  bool bVar2;
  TargetType TVar3;
  PolicyStatus PVar4;
  int iVar5;
  cmExportSet *pcVar6;
  pointer ppcVar7;
  char *pcVar8;
  ostream *poVar9;
  string *psVar10;
  byte bVar11;
  char *pcVar12;
  bool bVar13;
  pointer pbVar14;
  bool bVar15;
  pair<std::_Rb_tree_iterator<cmGeneratorTarget_*>,_bool> pVar16;
  string expectedTargets;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  missingTargets;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  pointer local_1f0;
  vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> allTargets;
  cmTargetExport *te;
  ostringstream e;
  undefined4 local_1a0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  undefined4 *local_188;
  undefined8 local_180;
  
  allTargets.super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  expectedTargets._M_dataplus._M_p = (pointer)&expectedTargets.field_2;
  expectedTargets._M_string_length = 0;
  allTargets.super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  allTargets.super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  expectedTargets.field_2._M_local_buf[0] = '\0';
  missingTargets.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)&missingTargets.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  missingTargets.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  missingTargets.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)missingTargets.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
  pcVar6 = this->IEGen->ExportSet;
  ppcVar7 = (pcVar6->TargetExports).
            super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    if (ppcVar7 ==
        (pcVar6->TargetExports).
        super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0xb])
                (this,os,&expectedTargets);
      std::__cxx11::string::~string((string *)&missingTargets);
      std::__cxx11::string::~string((string *)&expectedTargets);
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x13])(this,os);
      missingTargets.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      missingTargets.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      missingTargets.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar11 = 0;
      bVar13 = false;
      bVar1 = false;
      bVar15 = false;
      ppcVar7 = allTargets.super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      while (ppcVar7 !=
             allTargets.super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>.
             _M_impl.super__Vector_impl_data._M_finish) {
        this_00 = (*ppcVar7)->Target;
        bVar2 = !bVar15;
        bVar15 = true;
        local_1f0 = ppcVar7;
        if (bVar2) {
          TVar3 = cmGeneratorTarget::GetType(this_00);
          bVar15 = TVar3 != INTERFACE_LIBRARY;
        }
        (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[6])(this,os);
        ppcVar7 = local_1f0;
        local_1a0[0] = 0;
        local_198._M_allocated_capacity = 0;
        local_198._8_8_ = local_1a0;
        local_180 = 0;
        local_188 = (undefined4 *)local_198._8_8_;
        cmExportFileGenerator::PopulateIncludeDirectoriesInterface
                  (&this->super_cmExportFileGenerator,*local_1f0,InstallInterface,
                   (ImportPropertyMap *)&e,&missingTargets);
        cmExportFileGenerator::PopulateSourcesInterface
                  (&this->super_cmExportFileGenerator,*ppcVar7,InstallInterface,
                   (ImportPropertyMap *)&e,&missingTargets);
        std::__cxx11::string::string
                  ((string *)&expectedTargets,"INTERFACE_SYSTEM_INCLUDE_DIRECTORIES",
                   (allocator *)&local_210);
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&expectedTargets,this_00,InstallInterface,
                   (ImportPropertyMap *)&e,&missingTargets);
        std::__cxx11::string::~string((string *)&expectedTargets);
        std::__cxx11::string::string
                  ((string *)&expectedTargets,"INTERFACE_COMPILE_DEFINITIONS",
                   (allocator *)&local_210);
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&expectedTargets,this_00,InstallInterface,
                   (ImportPropertyMap *)&e,&missingTargets);
        std::__cxx11::string::~string((string *)&expectedTargets);
        std::__cxx11::string::string
                  ((string *)&expectedTargets,"INTERFACE_COMPILE_OPTIONS",(allocator *)&local_210);
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&expectedTargets,this_00,InstallInterface,
                   (ImportPropertyMap *)&e,&missingTargets);
        std::__cxx11::string::~string((string *)&expectedTargets);
        std::__cxx11::string::string
                  ((string *)&expectedTargets,"INTERFACE_AUTOUIC_OPTIONS",(allocator *)&local_210);
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&expectedTargets,this_00,InstallInterface,
                   (ImportPropertyMap *)&e,&missingTargets);
        std::__cxx11::string::~string((string *)&expectedTargets);
        std::__cxx11::string::string
                  ((string *)&expectedTargets,"INTERFACE_COMPILE_FEATURES",(allocator *)&local_210);
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&expectedTargets,this_00,InstallInterface,
                   (ImportPropertyMap *)&e,&missingTargets);
        std::__cxx11::string::~string((string *)&expectedTargets);
        PVar4 = cmGeneratorTarget::GetPolicyStatusCMP0022(this_00);
        if (PVar4 != WARN) {
          PVar4 = cmGeneratorTarget::GetPolicyStatusCMP0022(this_00);
          if (PVar4 != OLD) {
            bVar2 = cmExportFileGenerator::PopulateInterfaceLinkLibrariesProperty
                              (&this->super_cmExportFileGenerator,this_00,InstallInterface,
                               (ImportPropertyMap *)&e,&missingTargets);
            if (bVar2) {
              bVar11 = bVar11 | (this->super_cmExportFileGenerator).ExportOld ^ 1U;
            }
          }
        }
        TVar3 = cmGeneratorTarget::GetType(this_00);
        std::__cxx11::string::string
                  ((string *)&expectedTargets,"INTERFACE_SOURCES",(allocator *)&local_210);
        pcVar8 = cmGeneratorTarget::GetProperty(this_00,&expectedTargets);
        std::__cxx11::string::~string((string *)&expectedTargets);
        std::__cxx11::string::string
                  ((string *)&expectedTargets,"INTERFACE_POSITION_INDEPENDENT_CODE",
                   (allocator *)&local_210);
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&expectedTargets,this_00,
                   (ImportPropertyMap *)&e);
        std::__cxx11::string::~string((string *)&expectedTargets);
        cmExportFileGenerator::PopulateCompatibleInterfaceProperties
                  (&this->super_cmExportFileGenerator,this_00,(ImportPropertyMap *)&e);
        (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0xf])(this,this_00,os,&e);
        bVar13 = (bool)(bVar13 | TVar3 == INTERFACE_LIBRARY);
        bVar1 = (bool)(bVar1 | pcVar8 != (char *)0x0);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&e);
        ppcVar7 = local_1f0 + 1;
      }
      if ((bVar1 || bVar13) || (bVar11 & 1) != 0) {
        pcVar8 = "2.8.12";
        if (bVar13) {
          pcVar8 = "3.0.0";
        }
        pcVar12 = "3.1.0";
        if (!bVar1) {
          pcVar12 = pcVar8;
        }
        (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x10])(this,os,pcVar12);
      }
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x14])(this,os);
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x15])(this,os);
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[9])(this,os);
      bVar13 = true;
      if (bVar15) {
        bVar13 = true;
        for (pbVar14 = (this->super_cmExportFileGenerator).Configurations.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            pbVar14 !=
            (this->super_cmExportFileGenerator).Configurations.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish; pbVar14 = pbVar14 + 1) {
          iVar5 = (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x16])
                            (this,pbVar14,&missingTargets);
          bVar13 = (bool)(bVar13 & (byte)iVar5);
        }
      }
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[10])
                (this,os,&missingTargets);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&missingTargets);
LAB_0044fd7a:
      std::_Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::~_Vector_base
                (&allTargets.super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>
                );
      return bVar13;
    }
    std::operator+(&local_210,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &missingTargets,&(this->super_cmExportFileGenerator).Namespace);
    cmGeneratorTarget::GetExportName_abi_cxx11_((string *)&te,(*ppcVar7)->Target);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                   &local_210,(string *)&te);
    std::__cxx11::string::append((string *)&expectedTargets);
    std::__cxx11::string::~string((string *)&e);
    std::__cxx11::string::~string((string *)&te);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::assign((char *)&missingTargets);
    te = *ppcVar7;
    pVar16 = std::
             _Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
             ::_M_insert_unique<cmGeneratorTarget*const&>
                       ((_Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
                         *)&(this->super_cmExportFileGenerator).ExportedTargets,&te->Target);
    if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar9 = std::operator<<((ostream *)&e,"install(EXPORT \"");
      poVar9 = std::operator<<(poVar9,(string *)&this->IEGen->ExportSet->Name);
      poVar9 = std::operator<<(poVar9,"\" ...) ");
      poVar9 = std::operator<<(poVar9,"includes target \"");
      psVar10 = cmGeneratorTarget::GetName_abi_cxx11_(te->Target);
      poVar9 = std::operator<<(poVar9,(string *)psVar10);
      std::operator<<(poVar9,"\" more than once in the export set.");
      std::__cxx11::stringbuf::str();
      cmSystemTools::Error(local_210._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      std::__cxx11::string::~string((string *)&missingTargets);
      std::__cxx11::string::~string((string *)&expectedTargets);
      bVar13 = false;
      goto LAB_0044fd7a;
    }
    std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::push_back
              (&allTargets,(value_type *)&te);
    ppcVar7 = ppcVar7 + 1;
    pcVar6 = this->IEGen->ExportSet;
  } while( true );
}

Assistant:

bool cmExportInstallFileGenerator::GenerateMainFile(std::ostream& os)
{
  std::vector<cmTargetExport*> allTargets;
  {
    std::string expectedTargets;
    std::string sep;
    for (std::vector<cmTargetExport*>::const_iterator tei =
           this->IEGen->GetExportSet()->GetTargetExports()->begin();
         tei != this->IEGen->GetExportSet()->GetTargetExports()->end();
         ++tei) {
      expectedTargets +=
        sep + this->Namespace + (*tei)->Target->GetExportName();
      sep = " ";
      cmTargetExport* te = *tei;
      if (this->ExportedTargets.insert(te->Target).second) {
        allTargets.push_back(te);
      } else {
        std::ostringstream e;
        e << "install(EXPORT \"" << this->IEGen->GetExportSet()->GetName()
          << "\" ...) "
          << "includes target \"" << te->Target->GetName()
          << "\" more than once in the export set.";
        cmSystemTools::Error(e.str().c_str());
        return false;
      }
    }

    this->GenerateExpectedTargetsCode(os, expectedTargets);
  }

  // Compute the relative import prefix for the file
  this->GenerateImportPrefix(os);

  std::vector<std::string> missingTargets;

  bool require2_8_12 = false;
  bool require3_0_0 = false;
  bool require3_1_0 = false;
  bool requiresConfigFiles = false;
  // Create all the imported targets.
  for (std::vector<cmTargetExport*>::const_iterator tei = allTargets.begin();
       tei != allTargets.end(); ++tei) {
    cmGeneratorTarget* gt = (*tei)->Target;

    requiresConfigFiles =
      requiresConfigFiles || gt->GetType() != cmStateEnums::INTERFACE_LIBRARY;

    this->GenerateImportTargetCode(os, gt);

    ImportPropertyMap properties;

    this->PopulateIncludeDirectoriesInterface(
      *tei, cmGeneratorExpression::InstallInterface, properties,
      missingTargets);
    this->PopulateSourcesInterface(*tei,
                                   cmGeneratorExpression::InstallInterface,
                                   properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_SYSTEM_INCLUDE_DIRECTORIES", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_DEFINITIONS", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_OPTIONS", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_AUTOUIC_OPTIONS", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_FEATURES", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties, missingTargets);

    const bool newCMP0022Behavior =
      gt->GetPolicyStatusCMP0022() != cmPolicies::WARN &&
      gt->GetPolicyStatusCMP0022() != cmPolicies::OLD;
    if (newCMP0022Behavior) {
      if (this->PopulateInterfaceLinkLibrariesProperty(
            gt, cmGeneratorExpression::InstallInterface, properties,
            missingTargets) &&
          !this->ExportOld) {
        require2_8_12 = true;
      }
    }
    if (gt->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      require3_0_0 = true;
    }
    if (gt->GetProperty("INTERFACE_SOURCES")) {
      // We can only generate INTERFACE_SOURCES in CMake 3.3, but CMake 3.1
      // can consume them.
      require3_1_0 = true;
    }

    this->PopulateInterfaceProperty("INTERFACE_POSITION_INDEPENDENT_CODE", gt,
                                    properties);

    this->PopulateCompatibleInterfaceProperties(gt, properties);

    this->GenerateInterfaceProperties(gt, os, properties);
  }

  if (require3_1_0) {
    this->GenerateRequiredCMakeVersion(os, "3.1.0");
  } else if (require3_0_0) {
    this->GenerateRequiredCMakeVersion(os, "3.0.0");
  } else if (require2_8_12) {
    this->GenerateRequiredCMakeVersion(os, "2.8.12");
  }

  this->LoadConfigFiles(os);

  this->CleanupTemporaryVariables(os);
  this->GenerateImportedFileCheckLoop(os);

  bool result = true;
  // Generate an import file for each configuration.
  // Don't do this if we only export INTERFACE_LIBRARY targets.
  if (requiresConfigFiles) {
    for (std::vector<std::string>::const_iterator ci =
           this->Configurations.begin();
         ci != this->Configurations.end(); ++ci) {
      if (!this->GenerateImportFileConfig(*ci, missingTargets)) {
        result = false;
      }
    }
  }

  this->GenerateMissingTargetsCheckCode(os, missingTargets);

  return result;
}